

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O0

void __thiscall cmDependsFortran::cmDependsFortran(cmDependsFortran *this)

{
  allocator<char> local_31;
  string local_30;
  cmDependsFortran *local_10;
  cmDependsFortran *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  cmDepends::cmDepends(&this->super_cmDepends,(cmLocalGenerator *)0x0,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_cmDepends)._vptr_cmDepends = (_func_int **)&PTR__cmDependsFortran_00ae9c40;
  std::__cxx11::string::string((string *)&this->SourceFile);
  std::__cxx11::string::string((string *)&this->CompilerId);
  std::__cxx11::string::string((string *)&this->SModSep);
  std::__cxx11::string::string((string *)&this->SModExt);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->PPDefinitions);
  this->Internal = (cmDependsFortranInternals *)0x0;
  return;
}

Assistant:

cmDependsFortran::cmDependsFortran() = default;